

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O0

imagef * __thiscall basisu::imagef::set(imagef *this,image *src,vec4F *scale,vec4F *bias)

{
  uint32_t uVar1;
  uint32_t uVar2;
  color_rgba *pcVar3;
  image *in_RSI;
  imagef *in_RDI;
  color_rgba *src_pixel;
  uint32_t x;
  int y;
  uint32_t height;
  uint32_t width;
  float in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff5c;
  float in_stack_ffffffffffffff60;
  uint32_t in_stack_ffffffffffffff64;
  float v2;
  float in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  uint local_40;
  int local_3c;
  
  uVar1 = image::get_width(in_RSI);
  uVar2 = image::get_height(in_RSI);
  vec<4U,_float>::vec((vec<4U,_float> *)
                      CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                      in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,0.0,7.588756e-39);
  resize((imagef *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
         (uint32_t)in_stack_ffffffffffffff6c,(uint32_t)in_stack_ffffffffffffff68,
         in_stack_ffffffffffffff64,
         (vec4F *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  for (local_3c = 0; local_3c < (int)uVar2; local_3c = local_3c + 1) {
    for (local_40 = 0; local_40 < uVar1; local_40 = local_40 + 1) {
      pcVar3 = image::operator()((image *)CONCAT44(in_stack_ffffffffffffff74,
                                                   in_stack_ffffffffffffff70),
                                 (uint32_t)in_stack_ffffffffffffff6c,
                                 (uint32_t)in_stack_ffffffffffffff68);
      operator()((imagef *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (uint32_t)in_stack_ffffffffffffff6c,(uint32_t)in_stack_ffffffffffffff68);
      in_stack_ffffffffffffff68 = (float)(pcVar3->field_0).m_comps[0];
      v2 = 0.0;
      in_stack_ffffffffffffff6c =
           vec<4U,_float>::operator[]
                     ((vec<4U,_float> *)(ulong)(uint)in_stack_ffffffffffffff60,
                      (uint32_t)in_stack_ffffffffffffff5c);
      in_stack_ffffffffffffff6c = in_stack_ffffffffffffff68 * in_stack_ffffffffffffff6c;
      vec<4U,_float>::operator[]
                ((vec<4U,_float> *)CONCAT44(v2,in_stack_ffffffffffffff60),
                 (uint32_t)in_stack_ffffffffffffff5c);
      in_stack_ffffffffffffff74 = (float)(pcVar3->field_0).m_comps[1];
      in_stack_ffffffffffffff70 = 1;
      vec<4U,_float>::operator[]
                ((vec<4U,_float> *)CONCAT44(v2,in_stack_ffffffffffffff60),
                 (uint32_t)in_stack_ffffffffffffff5c);
      vec<4U,_float>::operator[]
                ((vec<4U,_float> *)CONCAT44(v2,in_stack_ffffffffffffff60),
                 (uint32_t)in_stack_ffffffffffffff5c);
      vec<4U,_float>::operator[]
                ((vec<4U,_float> *)CONCAT44(v2,in_stack_ffffffffffffff60),
                 (uint32_t)in_stack_ffffffffffffff5c);
      vec<4U,_float>::operator[]
                ((vec<4U,_float> *)CONCAT44(v2,in_stack_ffffffffffffff60),
                 (uint32_t)in_stack_ffffffffffffff5c);
      vec<4U,_float>::operator[]
                ((vec<4U,_float> *)CONCAT44(v2,in_stack_ffffffffffffff60),
                 (uint32_t)in_stack_ffffffffffffff5c);
      vec<4U,_float>::operator[]
                ((vec<4U,_float> *)CONCAT44(v2,in_stack_ffffffffffffff60),
                 (uint32_t)in_stack_ffffffffffffff5c);
      vec<4U,_float>::set((vec<4U,_float> *)
                          CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                          in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,v2,
                          in_stack_ffffffffffffff60);
    }
  }
  return in_RDI;
}

Assistant:

imagef &set(const image &src, const vec4F &scale = vec4F(1), const vec4F &bias = vec4F(0))
		{
			const uint32_t width = src.get_width();
			const uint32_t height = src.get_height();

			resize(width, height);

			for (int y = 0; y < (int)height; y++)
			{
				for (uint32_t x = 0; x < width; x++)
				{
					const color_rgba &src_pixel = src(x, y);
					(*this)(x, y).set((float)src_pixel.r * scale[0] + bias[0], (float)src_pixel.g * scale[1] + bias[1], (float)src_pixel.b * scale[2] + bias[2], (float)src_pixel.a * scale[3] + bias[3]);
				}
			}

			return *this;
		}